

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O1

mg_path * mg_path_copy_ca(mg_path *path,mg_allocator *allocator)

{
  mg_unbound_relationship **ppmVar1;
  uint uVar2;
  uint uVar3;
  mg_path *buf;
  mg_node *pmVar4;
  mg_unbound_relationship *pmVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar2 = path->node_count;
  uVar3 = path->relationship_count;
  buf = (mg_path *)
        mg_allocator_malloc(&mg_system_allocator,
                            (ulong)uVar3 * 8 + (ulong)uVar2 * 8 + (ulong)path->sequence_length * 8 +
                            0x28);
  if (buf == (mg_path *)0x0) {
    buf = (mg_path *)0x0;
  }
  else {
    buf->nodes = (mg_node **)(buf + 1);
    buf->relationships = (mg_unbound_relationship **)(&buf[1].node_count + (ulong)uVar2 * 2);
    buf->sequence = (int64_t *)(&buf[1].node_count + (ulong)uVar2 * 2 + (ulong)uVar3 * 2);
  }
  if (buf != (mg_path *)0x0) {
    buf->node_count = 0;
    iVar6 = 2;
    if (path->node_count != 0) {
      lVar7 = 0;
      do {
        pmVar4 = mg_node_copy_ca(path->nodes[lVar7],allocator);
        buf->nodes[lVar7] = pmVar4;
        if (buf->nodes[lVar7] == (mg_node *)0x0) {
          iVar6 = 5;
          break;
        }
        buf->node_count = buf->node_count + 1;
        lVar7 = lVar7 + 1;
      } while ((uint)lVar7 < path->node_count);
    }
    if (iVar6 != 5) {
      if (iVar6 != 2) {
        return buf;
      }
      buf->relationship_count = 0;
      bVar9 = path->relationship_count != 0;
      if (!bVar9) {
LAB_0010a20b:
        buf->sequence_length = path->sequence_length;
        memcpy(buf->sequence,path->sequence,(ulong)path->sequence_length << 3);
        return buf;
      }
      pmVar5 = mg_unbound_relationship_copy_ca(*path->relationships,allocator);
      *buf->relationships = pmVar5;
      if (*buf->relationships != (mg_unbound_relationship *)0x0) {
        lVar7 = 1;
        do {
          buf->relationship_count = buf->relationship_count + 1;
          bVar9 = (uint)lVar7 < path->relationship_count;
          if (!bVar9) goto LAB_0010a20b;
          pmVar5 = mg_unbound_relationship_copy_ca(path->relationships[lVar7],allocator);
          buf->relationships[lVar7] = pmVar5;
          ppmVar1 = buf->relationships + lVar7;
          lVar7 = lVar7 + 1;
        } while (*ppmVar1 != (mg_unbound_relationship *)0x0);
      }
      if (!bVar9) goto LAB_0010a20b;
    }
    if (buf->node_count != 0) {
      uVar8 = 0;
      do {
        mg_node_destroy_ca(buf->nodes[uVar8],&mg_system_allocator);
        uVar8 = uVar8 + 1;
      } while (uVar8 < buf->node_count);
    }
    if (buf->relationship_count != 0) {
      uVar8 = 0;
      do {
        mg_unbound_relationship_destroy_ca(buf->relationships[uVar8],&mg_system_allocator);
        uVar8 = uVar8 + 1;
      } while (uVar8 < buf->relationship_count);
    }
    mg_allocator_free(&mg_system_allocator,buf);
  }
  return (mg_path *)0x0;
}

Assistant:

mg_path *mg_path_copy_ca(const mg_path *path, mg_allocator *allocator) {
  mg_path *npath = mg_path_alloc(path->node_count, path->relationship_count,
                                 path->sequence_length, &mg_system_allocator);
  if (!npath) {
    return NULL;
  }
  npath->node_count = 0;
  for (uint32_t i = 0; i < path->node_count; ++i) {
    npath->nodes[i] = mg_node_copy_ca(path->nodes[i], allocator);
    if (!npath->nodes[i]) {
      goto cleanup;
    }
    npath->node_count++;
  }
  npath->relationship_count = 0;
  for (uint32_t i = 0; i < path->relationship_count; ++i) {
    npath->relationships[i] =
        mg_unbound_relationship_copy_ca(path->relationships[i], allocator);
    if (!npath->relationships[i]) {
      goto cleanup;
    }
    npath->relationship_count++;
  }
  npath->sequence_length = path->sequence_length;
  memcpy(npath->sequence, path->sequence,
         path->sequence_length * sizeof(int64_t));
  return npath;

cleanup:
  for (uint32_t i = 0; i < npath->node_count; ++i) {
    mg_node_destroy(npath->nodes[i]);
  }
  for (uint32_t i = 0; i < npath->relationship_count; ++i) {
    mg_unbound_relationship_destroy(npath->relationships[i]);
  }
  mg_allocator_free(&mg_system_allocator, npath);
  return NULL;
}